

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall despot::VNode::PrintPolicyTree(VNode *this,int depth,ostream *os)

{
  _Base_ptr p_Var1;
  double dVar2;
  int iVar3;
  pointer ppQVar4;
  QNode *pQVar5;
  ostream *poVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  mapped_type *ppVVar9;
  long lVar10;
  long lVar11;
  unsigned_long *puVar12;
  _Self __tmp;
  ulong uVar13;
  QNode *pQVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> labels;
  unsigned_long *local_98;
  iterator iStack_90;
  unsigned_long *local_88;
  ostream *local_80;
  string local_78;
  string local_58;
  VNode *local_38;
  
  if ((depth == -1) || (this->depth_ <= depth)) {
    ppQVar4 = (this->children_).
              super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar10 = (long)(this->children_).
                   super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ppQVar4;
    if (lVar10 == 0) {
      iVar3 = (this->default_move_).action;
      poVar6 = std::ostream::_M_insert<void_const*>(os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-a=",3);
      plVar7 = (long *)std::ostream::operator<<(poVar6,iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      return;
    }
    lVar10 = lVar10 >> 3;
    lVar11 = 0;
    pQVar14 = (QNode *)0x0;
    do {
      pQVar5 = ppQVar4[lVar11];
      if ((pQVar14 == (QNode *)0x0) ||
         (dVar2 = pQVar5->lower_bound_,
         pQVar14->lower_bound_ <= dVar2 && dVar2 != pQVar14->lower_bound_)) {
        pQVar14 = pQVar5;
      }
      lVar11 = lVar11 + 1;
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
    local_80 = os;
    poVar6 = std::ostream::_M_insert<void_const*>(os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-a=",3);
    plVar7 = (long *)std::ostream::operator<<(poVar6,pQVar14->edge_);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    local_98 = (unsigned_long *)0x0;
    iStack_90._M_current = (unsigned_long *)0x0;
    local_88 = (unsigned_long *)0x0;
    p_Var8 = *(_Base_ptr *)((long)&(pQVar14->children_)._M_t._M_impl + 0x18);
    p_Var1 = (_Base_ptr)((long)&(pQVar14->children_)._M_t._M_impl + 8);
    if (p_Var8 != p_Var1) {
      do {
        if (iStack_90._M_current == local_88) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,iStack_90,
                     (unsigned_long *)(p_Var8 + 1));
        }
        else {
          *iStack_90._M_current = *(unsigned_long *)(p_Var8 + 1);
          iStack_90._M_current = iStack_90._M_current + 1;
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != p_Var1);
      puVar12 = local_98;
      if (iStack_90._M_current != local_98) {
        uVar13 = 0;
        local_38 = this;
        do {
          if ((depth == -1) || (this->depth_ < depth)) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"|   ","");
            repeat(&local_78,&local_58,this->depth_);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_80,local_78._M_dataplus._M_p,local_78._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"| o=",4);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            local_78._M_dataplus._M_p = (pointer)local_98[uVar13];
            ppVVar9 = std::
                      map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                      ::operator[](&pQVar14->children_,(key_type *)&local_78);
            PrintPolicyTree(*ppVVar9,depth,local_80);
            puVar12 = local_98;
            this = local_38;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)((long)iStack_90._M_current - (long)puVar12 >> 3));
      }
      if (puVar12 != (unsigned_long *)0x0) {
        operator_delete(puVar12,(long)local_88 - (long)puVar12);
      }
    }
  }
  return;
}

Assistant:

void VNode::PrintPolicyTree(int depth, ostream& os) {
	if (depth != -1 && this->depth() > depth)
		return;

	vector<QNode*>& qnodes = children();
	if (qnodes.size() == 0) {
		ACT_TYPE astar = this->default_move().action;
		os << this << "-a=" << astar << endl;
	} else {
		QNode* qstar = NULL;
		for (int a = 0; a < qnodes.size(); a++) {
			QNode* qnode = qnodes[a];
			if (qstar == NULL || qnode->lower_bound() > qstar->lower_bound()) {
				qstar = qnode;
			}
		}

		os << this << "-a=" << qstar->edge() << endl;

		vector<OBS_TYPE> labels;
		map<OBS_TYPE, VNode*>& vnodes = qstar->children();
		for (map<OBS_TYPE, VNode*>::iterator it = vnodes.begin();
			it != vnodes.end(); it++) {
			labels.push_back(it->first);
		}

		for (int i = 0; i < labels.size(); i++) {
			if (depth == -1 || this->depth() + 1 <= depth) {
				os << repeat("|   ", this->depth()) << "| o=" << labels[i]
					<< ": ";
				qstar->Child(labels[i])->PrintPolicyTree(depth, os);
			}
		}
	}
}